

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d717::VectorMerge<unsigned_long>::VectorMerge
          (VectorMerge<unsigned_long> *this,int insert_point,int input_length,int insert_length,
          bool recursive,bool overwrite_mode,istream *insert_stream)

{
  bool bVar1;
  istream *sequence_to_read;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  istream *in_RDI;
  byte in_R8B;
  byte in_R9B;
  undefined4 local_5c;
  int local_4c;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  
  VectorMergeInterface::VectorMergeInterface((VectorMergeInterface *)in_RDI);
  *(undefined ***)in_RDI = &PTR__VectorMerge_00137bf8;
  *(undefined4 *)(in_RDI + 8) = in_ESI;
  *(undefined4 *)(in_RDI + 0xc) = in_EDX;
  *(undefined4 *)(in_RDI + 0x10) = in_ECX;
  sequence_to_read = in_RDI + 0x14;
  if ((in_R9B & 1) == 0) {
    local_4c = *(int *)(in_RDI + 0xc) + *(int *)(in_RDI + 0x10);
  }
  else {
    local_4c = *(int *)(in_RDI + 0xc);
  }
  *(int *)sequence_to_read = local_4c;
  *(int *)(in_RDI + 0x18) =
       (*(int *)(in_RDI + 0x14) - *(int *)(in_RDI + 8)) - *(int *)(in_RDI + 0x10);
  if ((in_R9B & 1) == 0) {
    local_5c = 0;
  }
  else {
    local_5c = *(undefined4 *)(in_RDI + 0x10);
  }
  *(undefined4 *)(in_RDI + 0x1c) = local_5c;
  in_RDI[0x20] = (istream)(in_R8B & 1);
  in_RDI[0x21] = (istream)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x108188);
  if ((((byte)in_RDI[0x20] & 1) != 0) &&
     (bVar1 = sptk::ReadStream<unsigned_long>
                        ((bool)in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0,
                         in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)sequence_to_read,
                         in_RDI,(int *)CONCAT44(in_ESI,in_EDX)), bVar1)) {
    in_RDI[0x21] = (istream)0x1;
  }
  return;
}

Assistant:

VectorMerge(int insert_point, int input_length, int insert_length,
              bool recursive, bool overwrite_mode,
              std::istream* insert_stream = NULL)
      : insert_point_(insert_point),
        input_length_(input_length),
        insert_length_(insert_length),
        merged_length_(overwrite_mode ? input_length_
                                      : input_length_ + insert_length_),
        input_rest_length_(merged_length_ - insert_point_ - insert_length_),
        input_skip_length_(overwrite_mode ? insert_length_ : 0),
        recursive_(recursive),
        has_vector_(false) {
    if (recursive_ && sptk::ReadStream(false, 0, 0, insert_length_,
                                       &insert_vector_, insert_stream, NULL)) {
      has_vector_ = true;
    }
  }